

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

void __thiscall Fluid::grid_to_particle(Fluid *this)

{
  PFNGLDISPATCHCOMPUTEPROC p_Var1;
  PFNGLUNIFORM1FPROC p_Var2;
  PFNGLUNIFORM3FVPROC p_Var3;
  PFNGLUNIFORM3IVPROC p_Var4;
  GLint GVar5;
  GLuint GVar6;
  float *pfVar7;
  int *piVar8;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Fluid *local_10;
  Fluid *this_local;
  
  local_10 = this;
  ssbo_barrier(this);
  gfx::Program::use(&this->grid_to_particle_program);
  p_Var3 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"bounds_min",&local_31);
  GVar5 = gfx::Program::uniform_loc(&this->grid_to_particle_program,&local_30);
  pfVar7 = glm::value_ptr<float,(glm::qualifier)0>(&this->bounds_min);
  (*p_Var3)(GVar5,1,pfVar7);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  p_Var3 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"bounds_max",&local_69);
  GVar5 = gfx::Program::uniform_loc(&this->grid_to_particle_program,&local_68);
  pfVar7 = glm::value_ptr<float,(glm::qualifier)0>(&this->bounds_max);
  (*p_Var3)(GVar5,1,pfVar7);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  p_Var4 = glad_glUniform3iv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"grid_dim",&local_91);
  GVar5 = gfx::Program::uniform_loc(&this->grid_to_particle_program,&local_90);
  piVar8 = glm::value_ptr<int,(glm::qualifier)0>(&this->grid_dimensions);
  (*p_Var4)(GVar5,1,piVar8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  p_Var2 = glad_glUniform1f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"pic_flip_blend",&local_b9)
  ;
  GVar5 = gfx::Program::uniform_loc(&this->grid_to_particle_program,&local_b8);
  (*p_Var2)(GVar5,this->pic_flip_blend);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  gfx::Program::validate(&this->grid_to_particle_program);
  p_Var1 = glad_glDispatchCompute;
  GVar6 = gfx::Buffer::length(&this->particle_ssbo);
  (*p_Var1)(GVar6,1,1);
  gfx::Program::disuse(&this->grid_to_particle_program);
  return;
}

Assistant:

void grid_to_particle() {
        ssbo_barrier();
        grid_to_particle_program.use();
        glUniform3fv(grid_to_particle_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(grid_to_particle_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(grid_to_particle_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        glUniform1f(grid_to_particle_program.uniform_loc("pic_flip_blend"), pic_flip_blend);
        grid_to_particle_program.validate();
        glDispatchCompute(particle_ssbo.length(), 1, 1);
        grid_to_particle_program.disuse();
    }